

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O2

void Saig_CollectSatValues(sat_solver *pSat,Cnf_Dat_t *pCnf,Vec_Ptr_t *vInfo,int *piPat)

{
  int iVar1;
  Vec_Ptr_t *p;
  uint uVar2;
  void *pvVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  
  lVar6 = 0;
  do {
    p = pCnf->pMan->vObjs;
    if (p->nSize <= lVar6) {
      return;
    }
    pvVar3 = Vec_PtrEntry(p,(int)lVar6);
    if ((pvVar3 != (void *)0x0) &&
       ((uVar2 = *(uint *)((long)pvVar3 + 0x18) & 7, uVar2 == 2 || (uVar2 - 5 < 2)))) {
      if (pCnf->pVarNums[lVar6] < 1) {
        __assert_fail("pCnf->pVarNums[i] > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigConstr2.c"
                      ,0x1fa,
                      "void Saig_CollectSatValues(sat_solver *, Cnf_Dat_t *, Vec_Ptr_t *, int *)");
      }
      pvVar3 = Vec_PtrEntry(vInfo,(int)lVar6);
      lVar5 = (long)(*piPat >> 5);
      uVar2 = *(uint *)((long)pvVar3 + lVar5 * 4);
      uVar4 = *piPat & 0x1f;
      iVar1 = pCnf->pVarNums[lVar6];
      if (((long)iVar1 < 0) || (pSat->size <= iVar1)) {
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0xda,"int sat_solver_var_value(sat_solver *, int)");
      }
      if (((pSat->model[iVar1] != 1 ^ (byte)(uVar2 >> (sbyte)uVar4)) & 1) == 0) {
        *(uint *)((long)pvVar3 + lVar5 * 4) = uVar2 ^ 1 << uVar4;
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void Saig_CollectSatValues( sat_solver * pSat, Cnf_Dat_t * pCnf, Vec_Ptr_t * vInfo, int * piPat )
{
    Aig_Obj_t * pObj;
    unsigned * pInfo;
    int i;
    Aig_ManForEachObj( pCnf->pMan, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        assert( pCnf->pVarNums[i] > 0 );
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, i );
        if ( Abc_InfoHasBit(pInfo, *piPat) != sat_solver_var_value(pSat, pCnf->pVarNums[i]) )
            Abc_InfoXorBit(pInfo, *piPat);
    }
}